

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::argument_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,Parameter *arg)

{
  char *pcVar1;
  uint32_t uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  char *local_30;
  char *direction;
  SPIRType *type;
  Parameter *arg_local;
  CompilerGLSL *this_local;
  
  type = (SPIRType *)arg;
  arg_local = (Parameter *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&arg->id);
  direction = (char *)Compiler::expression_type(&this->super_Compiler,uVar2);
  local_30 = "";
  if ((((SPIRType *)direction)->pointer & 1U) != 0) {
    if ((*(int *)&(type->super_IVariant).field_0xc == 0) || ((type->super_IVariant).self.id == 0)) {
      if (*(int *)&(type->super_IVariant).field_0xc != 0) {
        local_30 = "out ";
      }
    }
    else {
      local_30 = "inout ";
    }
  }
  uVar2 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)((long)&(type->super_IVariant)._vptr_IVariant + 4));
  (*(this->super_Compiler)._vptr_Compiler[0x32])(local_50,this,(ulong)uVar2);
  pcVar1 = direction;
  uVar2 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)((long)&(type->super_IVariant)._vptr_IVariant + 4));
  (*(this->super_Compiler)._vptr_Compiler[6])(local_90,this,(ulong)uVar2,1);
  uVar2 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)((long)&(type->super_IVariant)._vptr_IVariant + 4));
  ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar2;
  (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_70,this,pcVar1,local_90);
  join<char_const*&,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(spirv_cross *)&local_30,(char **)local_50,&local_70,ts_2);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string(local_90);
  ::std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::argument_decl(const SPIRFunction::Parameter &arg)
{
	// glslangValidator seems to make all arguments pointer no matter what which is rather bizarre ...
	auto &type = expression_type(arg.id);
	const char *direction = "";

	if (type.pointer)
	{
		if (arg.write_count && arg.read_count)
			direction = "inout ";
		else if (arg.write_count)
			direction = "out ";
	}

	return join(direction, to_qualifiers_glsl(arg.id), variable_decl(type, to_name(arg.id), arg.id));
}